

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forward16.c
# Opt level: O0

void intobucket(bucket_conflict *b,list_conflict head,list_conflict tail,int size,group_conflict g)

{
  bucket_conflict pbVar1;
  bucket newb;
  bucket btemp;
  group_conflict g_local;
  int size_local;
  list_conflict tail_local;
  list_conflict head_local;
  bucket_conflict *b_local;
  
  newb = *b;
  if ((newb == (bucket_conflict)0x0) || (newb->tag != g)) {
    pbVar1 = (bucket_conflict)allocmem(bucketmem,0x28);
    pbVar1->next = newb;
    pbVar1->head = head;
    pbVar1->size = size;
    pbVar1->tag = g;
    *b = pbVar1;
    newb = pbVar1;
  }
  else {
    newb->tail->next = head;
    newb->size = size + newb->size;
  }
  tail->next = (list)0x0;
  newb->tail = tail;
  return;
}

Assistant:

static void intobucket(bucket *b, list head, list tail,
                       int size, group g)
{
   bucket btemp = *b, newb;

   if (!btemp || btemp->tag != g) {   /* create new tag */
      newb = (bucket) allocmem(bucketmem, sizeof(struct bucketrec));
      newb->next = btemp;
      newb->head = head;
      newb->size = size;
      newb->tag = g;
      *b = btemp = newb;
   } else {   /* append */
      btemp->tail->next = head;
      btemp->size += size;
   }
   tail->next = NULL;
   btemp->tail = tail;
}